

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O2

Curl_tree * Curl_splayinsert(timeval i,Curl_tree *t,Curl_tree *node)

{
  long lVar1;
  Curl_tree *pCVar2;
  Curl_tree *pCVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = i.tv_usec;
  lVar5 = i.tv_sec;
  if (node != (Curl_tree *)0x0) {
    if (t == (Curl_tree *)0x0) {
      node->smaller = (Curl_tree *)0x0;
      node->larger = (Curl_tree *)0x0;
    }
    else {
      pCVar3 = Curl_splay(i,t);
      lVar1 = (pCVar3->key).tv_sec;
      if ((lVar1 == lVar5) && ((pCVar3->key).tv_usec == lVar4)) {
        node->same = pCVar3;
        (node->key).tv_sec = lVar5;
        (node->key).tv_usec = lVar4;
        pCVar2 = pCVar3->larger;
        node->smaller = pCVar3->smaller;
        node->larger = pCVar2;
        pCVar3->smaller = node;
        *(undefined4 *)&(pCVar3->key).tv_sec = 0xffffffff;
        *(undefined4 *)((long)&(pCVar3->key).tv_sec + 4) = 0xffffffff;
        *(undefined4 *)&(pCVar3->key).tv_usec = 0xffffffff;
        *(undefined4 *)((long)&(pCVar3->key).tv_usec + 4) = 0xffffffff;
        return node;
      }
      if ((lVar5 < lVar1) || ((lVar5 <= lVar1 && (lVar4 < (pCVar3->key).tv_usec)))) {
        node->smaller = pCVar3->smaller;
        node->larger = pCVar3;
        pCVar3->smaller = (Curl_tree *)0x0;
      }
      else {
        node->larger = pCVar3->larger;
        node->smaller = pCVar3;
        pCVar3->larger = (Curl_tree *)0x0;
      }
    }
    (node->key).tv_sec = lVar5;
    (node->key).tv_usec = lVar4;
    node->same = (Curl_tree *)0x0;
    t = node;
  }
  return t;
}

Assistant:

struct Curl_tree *Curl_splayinsert(struct timeval i,
                                   struct Curl_tree *t,
                                   struct Curl_tree *node)
{
  static const struct timeval KEY_NOTUSED = {-1, -1}; /* will *NEVER* appear */

  if(node == NULL)
    return t;

  if(t != NULL) {
    t = Curl_splay(i, t);
    if(compare(i, t->key)==0) {
      /* There already exists a node in the tree with the very same key. Build
         a linked list of nodes. We make the new 'node' struct the new master
         node and make the previous node the first one in the 'same' list. */

      node->same = t;
      node->key = i;
      node->smaller = t->smaller;
      node->larger = t->larger;

      t->smaller = node; /* in the sub node for this same key, we use the
                            smaller pointer to point back to the master
                            node */

      t->key = KEY_NOTUSED; /* and we set the key in the sub node to NOTUSED
                               to quickly identify this node as a subnode */

      return node; /* new root node */
    }
  }

  if(t == NULL) {
    node->smaller = node->larger = NULL;
  }
  else if(compare(i, t->key) < 0) {
    node->smaller = t->smaller;
    node->larger = t;
    t->smaller = NULL;

  }
  else {
    node->larger = t->larger;
    node->smaller = t;
    t->larger = NULL;
  }
  node->key = i;

  node->same = NULL; /* no identical node (yet) */
  return node;
}